

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O1

void __thiscall Qclass::Qupdate(Qclass *this,int lastAction,int lastState,int x,int y,int new_state)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  this->learn_rate = 0.5;
  this->disc_rew = 0.8;
  iVar1 = rewardfunc(this,lastAction,x,y);
  pdVar2 = this->Q[lastState] + lastAction;
  dVar4 = *pdVar2;
  if (this->restart == true) {
    dVar4 = (this->learn_rate * (double)iVar1 + dVar4) - dVar4;
  }
  else {
    if (new_state < 0x9c4) {
      lVar3 = 0;
      dVar5 = -100000.0;
      do {
        dVar6 = this->Q[new_state][lVar3];
        if (dVar6 <= dVar5) {
          dVar6 = dVar5;
        }
        lVar3 = lVar3 + 1;
        dVar5 = dVar6;
      } while (lVar3 != 4);
      dVar5 = (double)(int)dVar6;
    }
    else {
      dVar5 = -100000.0;
    }
    dVar4 = this->learn_rate * ((this->disc_rew * dVar5 + (double)iVar1) - dVar4) + dVar4;
  }
  *pdVar2 = dVar4;
  return;
}

Assistant:

void Qclass::Qupdate(int lastAction, int lastState, int x, int y,
                     int new_state) {
  Qclass::learn_rate = 0.5;
  Qclass::disc_rew = 0.8;
  int reward = Qclass::rewardfunc(lastAction, x, y);
  if (restart == true) {
    // Future Reward not taken into account in case of collisions
    Q[lastState][lastAction] = Q[lastState][lastAction] + learn_rate * (reward)
        - Q[lastState][lastAction];
  } else {
    Q[lastState][lastAction] = Q[lastState][lastAction]
        + learn_rate
            * (reward + (disc_rew * futurereward(new_state))
                - Q[lastState][lastAction]);
  }
}